

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastIntrinsics.h
# Opt level: O2

void NFastOps::TanhAvx2<false,true>(double *from,size_t size,double *to)

{
  double dVar1;
  ulong uVar2;
  size_t i;
  ulong uVar3;
  double *pdVar4;
  double *pdVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  
  uVar2 = size * 8 & 0xffffffffffffff80;
  auVar31._8_8_ = 0x4090000000000000;
  auVar31._0_8_ = 0x4090000000000000;
  auVar31._16_8_ = 0x4090000000000000;
  auVar31._24_8_ = 0x4090000000000000;
  auVar33._8_8_ = 0xc08ff80000000000;
  auVar33._0_8_ = 0xc08ff80000000000;
  auVar33._16_8_ = 0xc08ff80000000000;
  auVar33._24_8_ = 0xc08ff80000000000;
  auVar28._8_8_ = 0xbfd3a55c9a802161;
  auVar28._0_8_ = 0xbfd3a55c9a802161;
  auVar28._16_8_ = 0xbfd3a55c9a802161;
  auVar28._24_8_ = 0xbfd3a55c9a802161;
  auVar26._8_8_ = 0xbfb0ca61fe455ffa;
  auVar26._0_8_ = 0xbfb0ca61fe455ffa;
  auVar26._16_8_ = 0xbfb0ca61fe455ffa;
  auVar26._24_8_ = 0xbfb0ca61fe455ffa;
  auVar27._8_8_ = 0xbf8bc31d985ef88c;
  auVar27._0_8_ = 0xbf8bc31d985ef88c;
  auVar27._16_8_ = 0xbf8bc31d985ef88c;
  auVar27._24_8_ = 0xbf8bc31d985ef88c;
  auVar16._8_8_ = 0x4000000000000000;
  auVar16._0_8_ = 0x4000000000000000;
  auVar16._16_8_ = 0x4000000000000000;
  auVar16._24_8_ = 0x4000000000000000;
  for (uVar3 = 0; uVar3 < uVar2; uVar3 = uVar3 + 0x80) {
    pdVar4 = (double *)((long)from + uVar3);
    auVar34._0_8_ = *pdVar4 * -2.8853900817779268;
    auVar34._8_8_ = pdVar4[1] * -2.8853900817779268;
    auVar34._16_8_ = pdVar4[2] * -2.8853900817779268;
    auVar34._24_8_ = pdVar4[3] * -2.8853900817779268;
    auVar52 = vminpd_avx(auVar34,auVar31);
    auVar52 = vmaxpd_avx(auVar52,auVar33);
    auVar46 = vroundpd_avx(auVar52,1);
    auVar52 = vsubpd_avx(auVar52,auVar46);
    auVar51._0_8_ = auVar46._0_8_ + 6755399441055744.0;
    auVar51._8_8_ = auVar46._8_8_ + 6755399441055744.0;
    auVar51._16_8_ = auVar46._16_8_ + 6755399441055744.0;
    auVar51._24_8_ = auVar46._24_8_ + 6755399441055744.0;
    auVar58._0_8_ = auVar52._0_8_ * auVar52._0_8_;
    auVar58._8_8_ = auVar52._8_8_ * auVar52._8_8_;
    auVar58._16_8_ = auVar52._16_8_ * auVar52._16_8_;
    auVar58._24_8_ = auVar52._24_8_ * auVar52._24_8_;
    auVar12 = vfmadd213pd_fma(auVar26,auVar52,auVar28);
    auVar12 = vfmadd231pd_fma(ZEXT1632(auVar12),auVar58,auVar27);
    auVar46 = vsubpd_avx(auVar52,auVar58);
    auVar12 = vfmadd213pd_fma(auVar46,ZEXT1632(auVar12),auVar52);
    auVar35._0_8_ = auVar12._0_8_ + 1.0;
    auVar35._8_8_ = auVar12._8_8_ + 1.0;
    auVar35._16_8_ = 0x3ff0000000000000;
    auVar35._24_8_ = 0x3ff0000000000000;
    auVar52 = vpsllq_avx2(auVar51,0x34);
    auVar52 = vpaddq_avx2(auVar52,auVar35);
    auVar36._0_8_ = auVar52._0_8_ + 1.0;
    auVar36._8_8_ = auVar52._8_8_ + 1.0;
    auVar36._16_8_ = auVar52._16_8_ + 1.0;
    auVar36._24_8_ = auVar52._24_8_ + 1.0;
    auVar52 = vdivpd_avx(auVar16,auVar36);
    pdVar4 = (double *)((long)to + uVar3);
    *pdVar4 = auVar52._0_8_ + -1.0;
    pdVar4[1] = auVar52._8_8_ + -1.0;
    pdVar4[2] = auVar52._16_8_ + -1.0;
    pdVar4[3] = auVar52._24_8_ + -1.0;
    pdVar4 = (double *)((long)from + uVar3 + 0x20);
    auVar37._0_8_ = *pdVar4 * -2.8853900817779268;
    auVar37._8_8_ = pdVar4[1] * -2.8853900817779268;
    auVar37._16_8_ = pdVar4[2] * -2.8853900817779268;
    auVar37._24_8_ = pdVar4[3] * -2.8853900817779268;
    auVar52 = vminpd_avx(auVar37,auVar31);
    auVar52 = vmaxpd_avx(auVar52,auVar33);
    auVar46 = vroundpd_avx(auVar52,1);
    auVar52 = vsubpd_avx(auVar52,auVar46);
    auVar53._0_8_ = auVar46._0_8_ + 6755399441055744.0;
    auVar53._8_8_ = auVar46._8_8_ + 6755399441055744.0;
    auVar53._16_8_ = auVar46._16_8_ + 6755399441055744.0;
    auVar53._24_8_ = auVar46._24_8_ + 6755399441055744.0;
    auVar59._0_8_ = auVar52._0_8_ * auVar52._0_8_;
    auVar59._8_8_ = auVar52._8_8_ * auVar52._8_8_;
    auVar59._16_8_ = auVar52._16_8_ * auVar52._16_8_;
    auVar59._24_8_ = auVar52._24_8_ * auVar52._24_8_;
    auVar12 = vfmadd213pd_fma(auVar26,auVar52,auVar28);
    auVar12 = vfmadd231pd_fma(ZEXT1632(auVar12),auVar59,auVar27);
    auVar46 = vsubpd_avx(auVar52,auVar59);
    auVar12 = vfmadd213pd_fma(auVar46,ZEXT1632(auVar12),auVar52);
    auVar38._0_8_ = auVar12._0_8_ + 1.0;
    auVar38._8_8_ = auVar12._8_8_ + 1.0;
    auVar38._16_8_ = 0x3ff0000000000000;
    auVar38._24_8_ = 0x3ff0000000000000;
    auVar52 = vpsllq_avx2(auVar53,0x34);
    auVar52 = vpaddq_avx2(auVar52,auVar38);
    auVar39._0_8_ = auVar52._0_8_ + 1.0;
    auVar39._8_8_ = auVar52._8_8_ + 1.0;
    auVar39._16_8_ = auVar52._16_8_ + 1.0;
    auVar39._24_8_ = auVar52._24_8_ + 1.0;
    auVar52 = vdivpd_avx(auVar16,auVar39);
    pdVar4 = (double *)((long)to + uVar3 + 0x20);
    *pdVar4 = auVar52._0_8_ + -1.0;
    pdVar4[1] = auVar52._8_8_ + -1.0;
    pdVar4[2] = auVar52._16_8_ + -1.0;
    pdVar4[3] = auVar52._24_8_ + -1.0;
    pdVar4 = (double *)((long)from + uVar3 + 0x40);
    auVar40._0_8_ = *pdVar4 * -2.8853900817779268;
    auVar40._8_8_ = pdVar4[1] * -2.8853900817779268;
    auVar40._16_8_ = pdVar4[2] * -2.8853900817779268;
    auVar40._24_8_ = pdVar4[3] * -2.8853900817779268;
    auVar52 = vminpd_avx(auVar40,auVar31);
    auVar52 = vmaxpd_avx(auVar52,auVar33);
    auVar46 = vroundpd_avx(auVar52,1);
    auVar52 = vsubpd_avx(auVar52,auVar46);
    auVar54._0_8_ = auVar46._0_8_ + 6755399441055744.0;
    auVar54._8_8_ = auVar46._8_8_ + 6755399441055744.0;
    auVar54._16_8_ = auVar46._16_8_ + 6755399441055744.0;
    auVar54._24_8_ = auVar46._24_8_ + 6755399441055744.0;
    auVar60._0_8_ = auVar52._0_8_ * auVar52._0_8_;
    auVar60._8_8_ = auVar52._8_8_ * auVar52._8_8_;
    auVar60._16_8_ = auVar52._16_8_ * auVar52._16_8_;
    auVar60._24_8_ = auVar52._24_8_ * auVar52._24_8_;
    auVar12 = vfmadd213pd_fma(auVar26,auVar52,auVar28);
    auVar12 = vfmadd231pd_fma(ZEXT1632(auVar12),auVar60,auVar27);
    auVar46 = vsubpd_avx(auVar52,auVar60);
    auVar12 = vfmadd213pd_fma(auVar46,ZEXT1632(auVar12),auVar52);
    auVar41._0_8_ = auVar12._0_8_ + 1.0;
    auVar41._8_8_ = auVar12._8_8_ + 1.0;
    auVar41._16_8_ = 0x3ff0000000000000;
    auVar41._24_8_ = 0x3ff0000000000000;
    auVar52 = vpsllq_avx2(auVar54,0x34);
    auVar52 = vpaddq_avx2(auVar52,auVar41);
    auVar42._0_8_ = auVar52._0_8_ + 1.0;
    auVar42._8_8_ = auVar52._8_8_ + 1.0;
    auVar42._16_8_ = auVar52._16_8_ + 1.0;
    auVar42._24_8_ = auVar52._24_8_ + 1.0;
    auVar52 = vdivpd_avx(auVar16,auVar42);
    pdVar4 = (double *)((long)to + uVar3 + 0x40);
    *pdVar4 = auVar52._0_8_ + -1.0;
    pdVar4[1] = auVar52._8_8_ + -1.0;
    pdVar4[2] = auVar52._16_8_ + -1.0;
    pdVar4[3] = auVar52._24_8_ + -1.0;
    pdVar4 = (double *)((long)from + uVar3 + 0x60);
    auVar43._0_8_ = *pdVar4 * -2.8853900817779268;
    auVar43._8_8_ = pdVar4[1] * -2.8853900817779268;
    auVar43._16_8_ = pdVar4[2] * -2.8853900817779268;
    auVar43._24_8_ = pdVar4[3] * -2.8853900817779268;
    auVar52 = vminpd_avx(auVar43,auVar31);
    auVar52 = vmaxpd_avx(auVar52,auVar33);
    auVar46 = vroundpd_avx(auVar52,1);
    auVar52 = vsubpd_avx(auVar52,auVar46);
    auVar55._0_8_ = auVar46._0_8_ + 6755399441055744.0;
    auVar55._8_8_ = auVar46._8_8_ + 6755399441055744.0;
    auVar55._16_8_ = auVar46._16_8_ + 6755399441055744.0;
    auVar55._24_8_ = auVar46._24_8_ + 6755399441055744.0;
    auVar61._0_8_ = auVar52._0_8_ * auVar52._0_8_;
    auVar61._8_8_ = auVar52._8_8_ * auVar52._8_8_;
    auVar61._16_8_ = auVar52._16_8_ * auVar52._16_8_;
    auVar61._24_8_ = auVar52._24_8_ * auVar52._24_8_;
    auVar12 = vfmadd213pd_fma(auVar26,auVar52,auVar28);
    auVar12 = vfmadd231pd_fma(ZEXT1632(auVar12),auVar61,auVar27);
    auVar46 = vsubpd_avx(auVar52,auVar61);
    auVar12 = vfmadd213pd_fma(auVar46,ZEXT1632(auVar12),auVar52);
    auVar44._0_8_ = auVar12._0_8_ + 1.0;
    auVar44._8_8_ = auVar12._8_8_ + 1.0;
    auVar44._16_8_ = 0x3ff0000000000000;
    auVar44._24_8_ = 0x3ff0000000000000;
    auVar52 = vpsllq_avx2(auVar55,0x34);
    auVar52 = vpaddq_avx2(auVar52,auVar44);
    auVar45._0_8_ = auVar52._0_8_ + 1.0;
    auVar45._8_8_ = auVar52._8_8_ + 1.0;
    auVar45._16_8_ = auVar52._16_8_ + 1.0;
    auVar45._24_8_ = auVar52._24_8_ + 1.0;
    auVar52 = vdivpd_avx(auVar16,auVar45);
    pdVar4 = (double *)((long)to + uVar3 + 0x60);
    *pdVar4 = auVar52._0_8_ + -1.0;
    pdVar4[1] = auVar52._8_8_ + -1.0;
    pdVar4[2] = auVar52._16_8_ + -1.0;
    pdVar4[3] = auVar52._24_8_ + -1.0;
  }
  pdVar5 = (double *)((long)from + uVar2);
  pdVar4 = (double *)((long)to + uVar2);
  if ((size & 8) != 0) {
    auVar52._0_8_ = *pdVar5 * -2.8853900817779268;
    auVar52._8_8_ = pdVar5[1] * -2.8853900817779268;
    auVar52._16_8_ = pdVar5[2] * -2.8853900817779268;
    auVar52._24_8_ = pdVar5[3] * -2.8853900817779268;
    auVar52 = vminpd_avx(auVar52,auVar31);
    auVar52 = vmaxpd_avx(auVar52,auVar33);
    auVar46 = vroundpd_avx(auVar52,1);
    auVar52 = vsubpd_avx(auVar52,auVar46);
    auVar56._0_8_ = auVar46._0_8_ + 6755399441055744.0;
    auVar56._8_8_ = auVar46._8_8_ + 6755399441055744.0;
    auVar56._16_8_ = auVar46._16_8_ + 6755399441055744.0;
    auVar56._24_8_ = auVar46._24_8_ + 6755399441055744.0;
    auVar62._0_8_ = auVar52._0_8_ * auVar52._0_8_;
    auVar62._8_8_ = auVar52._8_8_ * auVar52._8_8_;
    auVar62._16_8_ = auVar52._16_8_ * auVar52._16_8_;
    auVar62._24_8_ = auVar52._24_8_ * auVar52._24_8_;
    auVar12 = vfmadd213pd_fma(auVar26,auVar52,auVar28);
    auVar12 = vfmadd231pd_fma(ZEXT1632(auVar12),auVar62,auVar27);
    auVar46 = vsubpd_avx(auVar52,auVar62);
    auVar12 = vfmadd213pd_fma(auVar46,ZEXT1632(auVar12),auVar52);
    auVar46._0_8_ = auVar12._0_8_ + 1.0;
    auVar46._8_8_ = auVar12._8_8_ + 1.0;
    auVar46._16_8_ = 0x3ff0000000000000;
    auVar46._24_8_ = 0x3ff0000000000000;
    auVar52 = vpsllq_avx2(auVar56,0x34);
    auVar52 = vpaddq_avx2(auVar52,auVar46);
    auVar47._0_8_ = auVar52._0_8_ + 1.0;
    auVar47._8_8_ = auVar52._8_8_ + 1.0;
    auVar47._16_8_ = auVar52._16_8_ + 1.0;
    auVar47._24_8_ = auVar52._24_8_ + 1.0;
    auVar52 = vdivpd_avx(auVar16,auVar47);
    *pdVar4 = auVar52._0_8_ + -1.0;
    pdVar4[1] = auVar52._8_8_ + -1.0;
    pdVar4[2] = auVar52._16_8_ + -1.0;
    pdVar4[3] = auVar52._24_8_ + -1.0;
    auVar48._0_8_ = pdVar5[4] * -2.8853900817779268;
    auVar48._8_8_ = pdVar5[5] * -2.8853900817779268;
    auVar48._16_8_ = pdVar5[6] * -2.8853900817779268;
    auVar48._24_8_ = pdVar5[7] * -2.8853900817779268;
    auVar52 = vminpd_avx(auVar48,auVar31);
    auVar52 = vmaxpd_avx(auVar52,auVar33);
    auVar46 = vroundpd_avx(auVar52,1);
    auVar52 = vsubpd_avx(auVar52,auVar46);
    auVar57._0_8_ = auVar46._0_8_ + 6755399441055744.0;
    auVar57._8_8_ = auVar46._8_8_ + 6755399441055744.0;
    auVar57._16_8_ = auVar46._16_8_ + 6755399441055744.0;
    auVar57._24_8_ = auVar46._24_8_ + 6755399441055744.0;
    auVar63._0_8_ = auVar52._0_8_ * auVar52._0_8_;
    auVar63._8_8_ = auVar52._8_8_ * auVar52._8_8_;
    auVar63._16_8_ = auVar52._16_8_ * auVar52._16_8_;
    auVar63._24_8_ = auVar52._24_8_ * auVar52._24_8_;
    auVar12 = vfmadd213pd_fma(auVar26,auVar52,auVar28);
    auVar12 = vfmadd231pd_fma(ZEXT1632(auVar12),auVar63,auVar27);
    auVar46 = vsubpd_avx(auVar52,auVar63);
    auVar12 = vfmadd213pd_fma(auVar46,ZEXT1632(auVar12),auVar52);
    auVar49._0_8_ = auVar12._0_8_ + 1.0;
    auVar49._8_8_ = auVar12._8_8_ + 1.0;
    auVar49._16_8_ = 0x3ff0000000000000;
    auVar49._24_8_ = 0x3ff0000000000000;
    auVar52 = vpsllq_avx2(auVar57,0x34);
    auVar52 = vpaddq_avx2(auVar52,auVar49);
    auVar50._0_8_ = auVar52._0_8_ + 1.0;
    auVar50._8_8_ = auVar52._8_8_ + 1.0;
    auVar50._16_8_ = auVar52._16_8_ + 1.0;
    auVar50._24_8_ = auVar52._24_8_ + 1.0;
    auVar52 = vdivpd_avx(auVar16,auVar50);
    pdVar4[4] = auVar52._0_8_ + -1.0;
    pdVar4[5] = auVar52._8_8_ + -1.0;
    pdVar4[6] = auVar52._16_8_ + -1.0;
    pdVar4[7] = auVar52._24_8_ + -1.0;
    pdVar4 = pdVar4 + 8;
    pdVar5 = pdVar5 + 8;
  }
  if ((size & 4) != 0) {
    auVar30._0_8_ = *pdVar5 * -2.8853900817779268;
    auVar30._8_8_ = pdVar5[1] * -2.8853900817779268;
    auVar30._16_8_ = pdVar5[2] * -2.8853900817779268;
    auVar30._24_8_ = pdVar5[3] * -2.8853900817779268;
    auVar31 = vminpd_avx(auVar30,auVar31);
    auVar31 = vmaxpd_avx(auVar31,auVar33);
    auVar33 = vroundpd_avx(auVar31,1);
    auVar31 = vsubpd_avx(auVar31,auVar33);
    auVar29._0_8_ = auVar33._0_8_ + 6755399441055744.0;
    auVar29._8_8_ = auVar33._8_8_ + 6755399441055744.0;
    auVar29._16_8_ = auVar33._16_8_ + 6755399441055744.0;
    auVar29._24_8_ = auVar33._24_8_ + 6755399441055744.0;
    auVar32._0_8_ = auVar31._0_8_ * auVar31._0_8_;
    auVar32._8_8_ = auVar31._8_8_ * auVar31._8_8_;
    auVar32._16_8_ = auVar31._16_8_ * auVar31._16_8_;
    auVar32._24_8_ = auVar31._24_8_ * auVar31._24_8_;
    auVar12 = vfmadd213pd_fma(auVar26,auVar31,auVar28);
    auVar12 = vfmadd213pd_fma(auVar27,auVar32,ZEXT1632(auVar12));
    auVar27 = vsubpd_avx(auVar31,auVar32);
    auVar12 = vfmadd213pd_fma(auVar27,ZEXT1632(auVar12),auVar31);
    auVar24._0_8_ = auVar12._0_8_ + 1.0;
    auVar24._8_8_ = auVar12._8_8_ + 1.0;
    auVar24._16_8_ = 0x3ff0000000000000;
    auVar24._24_8_ = 0x3ff0000000000000;
    auVar27 = vpsllq_avx2(auVar29,0x34);
    auVar27 = vpaddq_avx2(auVar27,auVar24);
    auVar8._0_8_ = auVar27._0_8_ + 1.0;
    auVar8._8_8_ = auVar27._8_8_ + 1.0;
    auVar8._16_8_ = auVar27._16_8_ + 1.0;
    auVar8._24_8_ = auVar27._24_8_ + 1.0;
    auVar16 = vdivpd_avx(auVar16,auVar8);
    *pdVar4 = auVar16._0_8_ + -1.0;
    pdVar4[1] = auVar16._8_8_ + -1.0;
    pdVar4[2] = auVar16._16_8_ + -1.0;
    pdVar4[3] = auVar16._24_8_ + -1.0;
    pdVar4 = pdVar4 + 4;
    pdVar5 = pdVar5 + 4;
  }
  if ((size & 2) != 0) {
    auVar12._0_8_ = *pdVar5 * -2.8853900817779268;
    auVar12._8_8_ = pdVar5[1] * -2.8853900817779268;
    auVar9._8_8_ = 0x4090000000000000;
    auVar9._0_8_ = 0x4090000000000000;
    auVar12 = vminpd_avx(auVar12,auVar9);
    auVar10._8_8_ = 0xc08ff80000000000;
    auVar10._0_8_ = 0xc08ff80000000000;
    auVar12 = vmaxpd_avx(auVar12,auVar10);
    auVar15 = vroundpd_avx(auVar12,1);
    auVar12 = vsubpd_avx(auVar12,auVar15);
    auVar11._0_8_ = auVar15._0_8_ + 6755399441055744.0;
    auVar11._8_8_ = auVar15._8_8_ + 6755399441055744.0;
    auVar17._0_8_ = auVar12._0_8_ * auVar12._0_8_;
    auVar17._8_8_ = auVar12._8_8_ * auVar12._8_8_;
    auVar22._8_8_ = 0xbfd3a55c9a802161;
    auVar22._0_8_ = 0xbfd3a55c9a802161;
    auVar25._8_8_ = 0xbfb0ca61fe455ffa;
    auVar25._0_8_ = 0xbfb0ca61fe455ffa;
    auVar15 = vfmadd213pd_fma(auVar25,auVar12,auVar22);
    auVar23._8_8_ = 0xbf8bc31d985ef88c;
    auVar23._0_8_ = 0xbf8bc31d985ef88c;
    auVar9 = vfmadd213pd_fma(auVar23,auVar17,auVar15);
    auVar15 = vsubpd_avx(auVar12,auVar17);
    auVar12 = vfmadd213pd_fma(auVar15,auVar9,auVar12);
    auVar18._0_8_ = auVar12._0_8_ + 1.0;
    auVar18._8_8_ = auVar12._8_8_ + 1.0;
    auVar12 = vpsllq_avx(auVar11,0x34);
    auVar12 = vpaddq_avx(auVar12,auVar18);
    auVar15._0_8_ = auVar12._0_8_ + 1.0;
    auVar15._8_8_ = auVar12._8_8_ + 1.0;
    auVar13._8_8_ = 0x4000000000000000;
    auVar13._0_8_ = 0x4000000000000000;
    auVar12 = vdivpd_avx(auVar13,auVar15);
    *pdVar4 = auVar12._0_8_ + -1.0;
    pdVar4[1] = auVar12._8_8_ + -1.0;
    pdVar4 = pdVar4 + 2;
    pdVar5 = pdVar5 + 2;
  }
  if ((size & 1) != 0) {
    auVar6._8_8_ = 0;
    auVar6._0_8_ = *pdVar5 * -2.8853900817779268;
    auVar12 = vminsd_avx(auVar6,ZEXT816(0x4090000000000000));
    auVar12 = vmaxsd_avx(auVar12,ZEXT816(0xc08ff80000000000));
    auVar15 = vroundsd_avx(auVar12,auVar12,1);
    dVar1 = auVar12._0_8_ - auVar15._0_8_;
    auVar14._0_8_ = auVar15._0_8_ + 6755399441055744.0;
    auVar14._8_8_ = auVar15._8_8_ + 6755399441055744.0;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = dVar1;
    auVar12 = vfmadd213sd_fma(ZEXT816(0xbfb0ca61fe455ffa),auVar7,ZEXT816(0xbfd3a55c9a802161));
    auVar19._8_8_ = 0;
    auVar19._0_8_ = dVar1 * dVar1;
    auVar12 = vfmadd231sd_fma(auVar12,auVar19,ZEXT816(0xbf8bc31d985ef88c));
    auVar20._8_8_ = 0;
    auVar20._0_8_ = dVar1 - dVar1 * dVar1;
    auVar12 = vfmadd213sd_fma(auVar20,auVar12,auVar7);
    auVar15 = vpsllq_avx(auVar14,0x34);
    auVar21._8_8_ = 0;
    auVar21._0_8_ = auVar12._0_8_ + 1.0;
    auVar12 = vpaddq_avx(auVar15,auVar21);
    *pdVar4 = 2.0 / (auVar12._0_8_ + 1.0) + -1.0;
  }
  return;
}

Assistant:

FORCE_INLINE void AVXTanh(const P_Type1& from, size_t size, P_Type2&& to) noexcept {
        AVX_FLOAT_EXP_LIKE_FUNC_CALL((AVXCopy<false, I_OutAligned>), S_Tanh, size * c_elem_size, c::c_neg_2_over_ln_2, c::c_2_f);
    }